

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2014f3::LineEdit::handleReturnPressed(LineEdit *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::text();
  pDVar2 = (this->origText).d.d;
  pcVar3 = (this->origText).d.ptr;
  (this->origText).d.d = local_38.d;
  (this->origText).d.ptr = local_38.ptr;
  qVar1 = (this->origText).d.size;
  (this->origText).d.size = local_38.size;
  local_38.d = pDVar2;
  local_38.ptr = pcVar3;
  local_38.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void handleReturnPressed()
    {
        origText = text();
    }